

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::generateMetacall(Generator *this)

{
  QList<FunctionDef> *this_00;
  IncludePath *pIVar1;
  bool bVar2;
  FILE *__s;
  char *pcVar3;
  ClassDef *pCVar4;
  long in_FS_OFFSET;
  size_t sStack_60;
  undefined1 local_50 [16];
  ClassDef *pCStack_40;
  Data *local_38;
  uint *local_30;
  
  local_30 = *(uint **)(in_FS_OFFSET + 0x28);
  local_50._8_8_ = "QObject";
  bVar2 = operator==((QByteArray *)this->cdef,(char **)(local_50 + 8));
  pcVar3 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar3);
  local_38 = (Data *)(this->purestSuperClass).d.size;
  if (!bVar2 && local_38 != (Data *)0x0) {
    local_50._8_8_ = (this->purestSuperClass).d.d;
    pCStack_40 = (ClassDef *)(this->purestSuperClass).d.ptr;
    if ((FILE *)local_50._8_8_ != (FILE *)0x0) {
      LOCK();
      *(int *)local_50._8_8_ = *(int *)local_50._8_8_ + 1;
      UNLOCK();
    }
    pCVar4 = pCStack_40;
    if (pCStack_40 == (ClassDef *)0x0) {
      pCVar4 = (ClassDef *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    _id = %s::qt_metacall(_c, _id, _a);\n",pCVar4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_50 + 8));
  }
  this_00 = (QList<FunctionDef> *)(local_50 + 8);
  local_38 = (Data *)0x0;
  local_50._8_8_ = (FILE *)0x0;
  pCStack_40 = (ClassDef *)0x0;
  QList<FunctionDef>::append(this_00,&this->cdef->signalList);
  QList<FunctionDef>::append(this_00,&this->cdef->slotList);
  QList<FunctionDef>::append(this_00,&this->cdef->methodList);
  if ((local_38 == (Data *)0x0) && ((this->cdef->propertyList).d.size == 0)) goto LAB_0010b514;
  fwrite("    if (_id < 0)\n        return _id;\n",0x25,1,(FILE *)this->out);
  if (local_38 == (Data *)0x0) goto LAB_0010b514;
  fwrite("    if (_c == QMetaObject::InvokeMetaMethod) {\n",0x2f,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        if (_id < %d)\n",(ulong)local_38 & 0xffffffff);
  fwrite("            qt_static_metacall(this, _c, _id, _a);\n",0x33,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        _id -= %d;\n    }\n",(ulong)local_38 & 0xffffffff);
  fwrite("    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n",0x3d,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        if (_id < %d)\n",(ulong)local_38 & 0xffffffff);
  methodsWithAutomaticTypesHelper((Generator *)local_50,(QList<FunctionDef> *)this);
  if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
       *)local_50._0_8_ ==
      (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
       *)0x0) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_50);
LAB_0010b4e8:
    __s = (FILE *)this->out;
    pcVar3 = "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n";
    sStack_60 = 0x41;
  }
  else {
    pIVar1 = *(IncludePath **)(local_50._0_8_ + 0x30);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_50);
    if (pIVar1 == (IncludePath *)0x0) goto LAB_0010b4e8;
    __s = (FILE *)this->out;
    pcVar3 = "            qt_static_metacall(this, _c, _id, _a);\n";
    sStack_60 = 0x33;
  }
  fwrite(pcVar3,sStack_60,1,__s);
  fprintf((FILE *)this->out,"        _id -= %d;\n    }\n",(ulong)local_38 & 0xffffffff);
LAB_0010b514:
  if ((this->cdef->propertyList).d.size != 0) {
    fprintf((FILE *)this->out,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n            || _c == QMetaObject::RegisterPropertyMetaType) {\n        qt_static_metacall(this, _c, _id, _a);\n        _id -= %d;\n    }\n"
           );
  }
  fwrite("    return _id;\n}\n",0x12,1,(FILE *)this->out);
  QArrayDataPointer<FunctionDef>::~QArrayDataPointer
            ((QArrayDataPointer<FunctionDef> *)(local_50 + 8));
  if (*(uint **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateMetacall()
{
    bool isQObject = (cdef->classname == "QObject");

    fprintf(out, "\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",
             cdef->qualified.constData());

    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    _id = %s::qt_metacall(_c, _id, _a);\n", superClass.constData());
    }


    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    // If there are no methods or properties, we will return _id anyway, so
    // don't emit this comparison -- it is unnecessary, and it makes coverity
    // unhappy.
    if (methodList.size() || cdef->propertyList.size()) {
        fprintf(out, "    if (_id < 0)\n        return _id;\n");
    }

    if (methodList.size()) {
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));
        fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

        fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));

        if (methodsWithAutomaticTypesHelper(methodList).isEmpty())
            fprintf(out, "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n");
        else
            fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

    }

    if (cdef->propertyList.size()) {
        fprintf(out,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n"
            "            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n"
            "            || _c == QMetaObject::RegisterPropertyMetaType) {\n"
            "        qt_static_metacall(this, _c, _id, _a);\n"
            "        _id -= %d;\n    }\n", int(cdef->propertyList.size()));
    }
    fprintf(out,"    return _id;\n}\n");
}